

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

void Extra_PrintHexadecimalString(char *pString,uint *Sign,int nVars)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  
  uVar1 = (long)(1 << ((byte)nVars & 0x1f)) / 4;
  uVar4 = uVar1 & 0xffffffff;
  iVar6 = (int)uVar1 * 4;
  while( true ) {
    iVar6 = iVar6 + -4;
    if ((int)uVar4 < 1) break;
    uVar3 = (int)uVar4 - 1;
    uVar4 = (ulong)uVar3;
    uVar3 = Sign[uVar3 >> 3] >> ((byte)iVar6 & 0x1c) & 0xf;
    cVar2 = (char)uVar3;
    cVar5 = cVar2 + 'W';
    if (uVar3 < 10) {
      cVar5 = cVar2 + '0';
    }
    *pString = cVar5;
    pString = pString + 1;
  }
  *pString = '\0';
  return;
}

Assistant:

void Extra_PrintHexadecimalString( char * pString, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pString++ = '0' + Digit;
        else
            *pString++ = 'a' + Digit-10;
    }
//    fprintf( pFile, "\n" );
    *pString = 0;
}